

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode.c
# Opt level: O0

_Bool reed_solomon_factorize_error_locator
                (field_t field,uint num_skip,polynomial_t locator_log,field_element_t *roots,
                field_logarithm_t **element_exp)

{
  polynomial_t poly_log;
  field_t field_00;
  field_element_t fVar1;
  undefined8 in_RCX;
  uint in_EDX;
  field_logarithm_t *in_RSI;
  field_element_t *in_RDI;
  uint in_R8D;
  long in_R9;
  field_operation_t i;
  uint root;
  undefined2 local_36;
  undefined4 local_34;
  undefined4 in_stack_ffffffffffffffd8;
  uint uVar2;
  undefined4 in_stack_ffffffffffffffec;
  
  uVar2 = in_EDX;
  memset((void *)(in_R9 + (ulong)in_EDX),0,(ulong)in_R8D);
  local_34 = in_EDX;
  for (local_36 = 0; local_36 < 0x100; local_36 = local_36 + 1) {
    field_00.log = in_RSI;
    field_00.exp = in_RDI;
    poly_log.order = in_R8D;
    poly_log.coeff = (field_element_t *)in_RCX;
    poly_log._12_4_ = in_stack_ffffffffffffffec;
    fVar1 = polynomial_eval_log_lut
                      (field_00,poly_log,
                       (field_logarithm_t *)CONCAT44(uVar2,in_stack_ffffffffffffffd8));
    if (fVar1 == '\0') {
      *(char *)(in_R9 + (ulong)local_34) = (char)local_36;
      local_34 = local_34 + 1;
    }
  }
  return local_34 == in_R8D + uVar2;
}

Assistant:

bool reed_solomon_factorize_error_locator(field_t field, unsigned int num_skip, polynomial_t locator_log, field_element_t *roots,
                                          field_logarithm_t **element_exp) {
    // normally it'd be tricky to find all the roots
    // but, the finite field is awfully finite...
    // just brute force search across every field element
    unsigned int root = num_skip;
    memset(roots + num_skip, 0, (locator_log.order) * sizeof(field_element_t));
    for (field_operation_t i = 0; i < 256; i++) {
        // we make two optimizations here to help this search go faster
        // a) we have precomputed the first successive powers of every single element
        //   in the field. we need at most n powers, where n is the largest possible
        //   degree of the error locator
        // b) we have precomputed the error locator polynomial in log form, which
        //   helps reduce some lookups that would be done here
        if (!polynomial_eval_log_lut(field, locator_log, element_exp[i])) {
            roots[root] = (field_element_t)i;
            root++;
        }
    }
    // this is where we find out if we are have too many errors to recover from
    // berlekamp-massey may have built an error locator that has 0 discrepancy
    // on the syndromes but doesn't have enough roots
    return root == locator_log.order + num_skip;
}